

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvafakebios.c
# Opt level: O0

uint16_t bios_edit_u16(uint8_t *vbios,size_t vbios_length,uint offs,uint16_t new)

{
  uint16_t orig;
  uint16_t new_local;
  uint offs_local;
  size_t vbios_length_local;
  uint8_t *vbios_local;
  
  if (offs + 1 < vbios_length) {
    vbios_local._6_2_ = CONCAT11(vbios[offs + 1],vbios[offs]);
    vbios[offs] = (uint8_t)new;
    vbios[offs + 1] = (uint8_t)(new >> 8);
  }
  else {
    fprintf(_stderr,"requested OOB u16 at 0x%04x\n",(ulong)offs);
    vbios_local._6_2_ = 0;
  }
  return vbios_local._6_2_;
}

Assistant:

uint16_t bios_edit_u16(uint8_t *vbios, size_t vbios_length, unsigned int offs, uint16_t new) {
	uint16_t orig = 0;
	if (offs+1 >= vbios_length) {
		fprintf(stderr, "requested OOB u16 at 0x%04x\n", offs);
		return 0;
	}
	orig = vbios[offs] | vbios[offs+1] << 8;
	vbios[offs + 0] = (new >> 0) & 0xff;
	vbios[offs + 1] = (new >> 8) & 0xff;
	return orig;
}